

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

void __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::Scale
          (BinaryPolynomialModel<unsigned_int,_double> *this,double scalar,
          PolynomialKeyList<unsigned_int> *ignored_interactions,bool ignored_offset)

{
  pointer pdVar1;
  pointer pvVar2;
  bool bVar3;
  bool bVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  long lVar7;
  long lVar8;
  PolynomialKeyList<unsigned_int> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *key;
  pointer pvVar9;
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  __it;
  key_type local_88;
  void *local_68;
  undefined8 uStack_60;
  long local_58;
  key_type local_48;
  
  lVar7 = (long)(this->poly_key_list_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->poly_key_list_).
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = (lVar7 >> 3) * -0x5555555555555555;
    pdVar1 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      pdVar1[lVar8] = pdVar1[lVar8] * scalar;
      lVar8 = lVar8 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
  }
  pvVar9 = (ignored_interactions->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (ignored_interactions->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar9 != pvVar2) {
    do {
      cVar5 = std::
              _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->poly_key_inv_)._M_h,pvVar9);
      if (cVar5.
          super__Node_iterator_base<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_true>
          ._M_cur != (__node_type *)0x0) {
        pmVar6 = std::__detail::
                 _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->poly_key_inv_,pvVar9);
        pdVar1 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar1[*pmVar6] = pdVar1[*pmVar6] * (1.0 / scalar);
      }
      pvVar9 = pvVar9 + 1;
    } while (pvVar9 != pvVar2);
  }
  if (ignored_offset) {
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cVar5 = std::
            _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->poly_key_inv_)._M_h,&local_48);
    if (cVar5.
        super__Node_iterator_base<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_true>
        ._M_cur != (__node_type *)0x0) {
      __it._M_current =
           (ignored_interactions->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      pvVar9 = (ignored_interactions->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_68;
      local_68 = (void *)0x0;
      uStack_60 = 0;
      local_58 = 0;
      bVar3 = true;
      bVar4 = true;
      if (__it._M_current != pvVar9) {
        lVar7 = 0;
        do {
          bVar4 = __gnu_cxx::__ops::
                  _Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>::
                  operator()((_Iter_equals_val<std::vector<unsigned_int,std::allocator<unsigned_int>>const>
                              *)&local_88,__it);
          lVar7 = lVar7 + (ulong)bVar4;
          __it._M_current = __it._M_current + 1;
        } while (__it._M_current != pvVar9);
        bVar4 = lVar7 == 0;
      }
      goto LAB_001a464f;
    }
  }
  bVar3 = false;
  bVar4 = false;
LAB_001a464f:
  if ((bVar3) && (local_68 != (void *)0x0)) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  if ((ignored_offset) &&
     (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar4) {
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pmVar6 = std::__detail::
             _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->poly_key_inv_,&local_88);
    pdVar1 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar1[*pmVar6] = (1.0 / scalar) * pdVar1[*pmVar6];
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Scale(
        const FloatType scalar,
        const PolynomialKeyList<IndexType> &ignored_interactions = {},
        const bool ignored_offset = false ) {

      std::size_t num_interactions = GetNumInteractions();

      for ( std::size_t i = 0; i < num_interactions; ++i ) {
        poly_value_list_[ i ] *= scalar;
      }

      FloatType scalar_inv = 1.0 / scalar;
      for ( const auto &key : ignored_interactions ) {
        if ( poly_key_inv_.count( key ) != 0 ) {
          poly_value_list_[ poly_key_inv_[ key ] ] *= scalar_inv;
        }
      }

      if ( ignored_offset == true && poly_key_inv_.count( std::vector<IndexType>{} ) != 0
           && std::count( ignored_interactions.begin(), ignored_interactions.end(), std::vector<IndexType>{} ) == 0 ) {
        poly_value_list_[ poly_key_inv_[ std::vector<IndexType>{} ] ] *= scalar_inv;
      }
    }